

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

ImGuiID ImGui::GetIDWithSeed(int n,ImGuiID seed)

{
  ImGuiID id;
  int n_local;
  
  id = ImHashData(&n_local,4,seed);
  if (GImGui->DebugHookIdInfo == id) {
    DebugHookIdInfo(id,4,(void *)(long)n,(void *)0x0);
  }
  return id;
}

Assistant:

ImGuiID ImGui::GetIDWithSeed(int n, ImGuiID seed)
{
    ImGuiID id = ImHashData(&n, sizeof(n), seed);
#ifndef IMGUI_DISABLE_DEBUG_TOOLS
    ImGuiContext& g = *GImGui;
    if (g.DebugHookIdInfo == id)
        DebugHookIdInfo(id, ImGuiDataType_S32, (void*)(intptr_t)n, NULL);
#endif
    return id;
}